

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.cc
# Opt level: O2

void __thiscall cnn::SimpleRNNBuilder::new_graph_impl(SimpleRNNBuilder *this,ComputationGraph *cg)

{
  Parameters *p;
  initializer_list<cnn::expr::Expression> __l;
  allocator_type local_c9;
  Parameters *local_c8;
  long local_c0;
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  *local_b8;
  ulong local_b0;
  Expression i_hb;
  Expression i_h2h;
  Expression i_x2h;
  Expression i_l2h;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> vars;
  
  local_b8 = &this->param_vars;
  local_c8 = (Parameters *)cg;
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::clear(local_b8);
  p = local_c8;
  local_c0 = 0;
  for (local_b0 = 0; local_b0 < this->layers; local_b0 = local_b0 + 1) {
    expr::parameter((ComputationGraph *)&i_x2h,p);
    expr::parameter((ComputationGraph *)&i_h2h,p);
    expr::parameter((ComputationGraph *)&i_hb,p);
    i_l2h.pg = i_x2h.pg;
    i_l2h.i = i_x2h.i;
    __l._M_len = 3;
    __l._M_array = (iterator)&i_l2h;
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
              ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
               &vars.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,
               __l,&local_c9);
    if (this->lagging == true) {
      expr::parameter((ComputationGraph *)&i_l2h,local_c8);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::push_back
                ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                 &vars.
                  super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,
                 (value_type *)&i_l2h);
    }
    std::
    vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
    ::push_back(local_b8,(value_type *)
                         &vars.
                          super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
               );
    std::_Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~_Vector_base
              (&vars.
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>);
    local_c0 = local_c0 + 0x18;
  }
  return;
}

Assistant:

void SimpleRNNBuilder::new_graph_impl(ComputationGraph& cg) {
  param_vars.clear();
  for (unsigned i = 0; i < layers; ++i) {
    Parameters* p_x2h = params[i][X2H];
    Parameters* p_h2h = params[i][H2H];
    Parameters* p_hb = params[i][HB];
    Expression i_x2h =  parameter(cg,p_x2h);
    Expression i_h2h =  parameter(cg,p_h2h);
    Expression i_hb =  parameter(cg,p_hb);
    vector<Expression> vars = {i_x2h, i_h2h, i_hb};

    if (lagging) {
        Parameters* p_l2h = params[i][L2H];
        Expression i_l2h =  parameter(cg,p_l2h);
        vars.push_back(i_l2h);
    }

    param_vars.push_back(vars);
  }
}